

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteFloat
               (int field_number,float value,CodedOutputStream *output)

{
  bool bVar1;
  float *ptr;
  float *pfVar2;
  byte *ptr_00;
  uint uVar3;
  uint uVar4;
  
  uVar4 = field_number << 3;
  ptr_00 = output->cur_;
  if ((output->impl_).end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr_00);
  }
  output->cur_ = ptr_00;
  if (uVar4 < 0x80) {
    *ptr_00 = (byte)uVar4 | 5;
    ptr = (float *)(ptr_00 + 1);
  }
  else {
    *ptr_00 = (byte)uVar4 | 0x85;
    if (uVar4 < 0x4000) {
      ptr_00[1] = (byte)(uVar4 >> 7);
      ptr = (float *)(ptr_00 + 2);
    }
    else {
      ptr = (float *)(ptr_00 + 2);
      uVar4 = uVar4 >> 7;
      do {
        pfVar2 = ptr;
        *(byte *)((long)pfVar2 + -1) = (byte)uVar4 | 0x80;
        uVar3 = uVar4 >> 7;
        ptr = (float *)((long)pfVar2 + 1);
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
      *(byte *)pfVar2 = (byte)uVar3;
    }
  }
  output->cur_ = (uint8 *)ptr;
  if ((output->impl_).end_ <= ptr) {
    ptr = (float *)io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,(uint8 *)ptr);
  }
  output->cur_ = (uint8 *)ptr;
  *ptr = value;
  output->cur_ = (uint8 *)(ptr + 1);
  return;
}

Assistant:

void WireFormatLite::WriteFloat(int field_number, float value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteFloatNoTag(value, output);
}